

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

DayOfWeek __thiscall QtPrivate::QCalendarModel::dayOfWeekForColumn(QCalendarModel *this,int column)

{
  int iVar1;
  int day;
  int col;
  int column_local;
  QCalendarModel *this_local;
  DayOfWeek local_4;
  
  iVar1 = column - this->m_firstColumn;
  if ((iVar1 < 0) || (6 < iVar1)) {
    local_4 = Sunday;
  }
  else {
    day = this->m_firstDay + iVar1;
    if (7 < day) {
      day = day + -7;
    }
    local_4 = day;
  }
  return local_4;
}

Assistant:

Qt::DayOfWeek QCalendarModel::dayOfWeekForColumn(int column) const
{
    int col = column - m_firstColumn;
    if (col < 0 || col > 6)
        return Qt::Sunday;
    int day = m_firstDay + col;
    if (day > 7)
        day -= 7;
    return Qt::DayOfWeek(day);
}